

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomMesh *mesh,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *__lhs;
  uint uVar1;
  FamilyType FVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  size_type sVar6;
  _Rb_tree_node_base *p_Var7;
  FamilyType *pFVar8;
  mapped_type *pmVar9;
  mapped_type *this;
  ostream *poVar10;
  uint *args;
  GeomMesh *this_00;
  undefined **in;
  int iVar11;
  char *pcVar12;
  optional<tinyusdz::Relationship> *this_01;
  Property *pPVar13;
  _Rb_tree_node_base *p_Var14;
  undefined8 in_stack_fffffffffffff8f8;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *target;
  string local_6e8;
  _Rb_tree_node_base *local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
  *local_658;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
  *local_650;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *local_648;
  optional<tinyusdz::Relationship> *local_640;
  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
  *local_638;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_630;
  string *local_628;
  string *local_620;
  string *local_618;
  string *local_610;
  string *local_608;
  string *local_600;
  string *local_5f8;
  string *local_5f0;
  string *local_5e8;
  optional<tinyusdz::Relationship> *local_5e0;
  string *local_5d8;
  string *local_5d0;
  ParseResult ret;
  ostringstream ss_e;
  undefined3 uStack_447;
  storage_t<tinyusdz::Interpolation> sStack_444;
  code *local_438 [69];
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_210;
  _Any_data local_1f0;
  code *local_1e0;
  _Any_data local_1d0;
  code *local_1c0;
  _Any_data local_1b0;
  code *local_1a0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            *)CONCAT44((int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                       (uint)options->strict_allowedToken_check);
  args = (uint *)mesh;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&mesh->super_GPrim,warn,err,options->strict_allowedToken_check);
  if (bVar3) {
    p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_640 = &mesh->skeleton;
    local_5d0 = (string *)&mesh->points;
    local_5d8 = (string *)&mesh->normals;
    local_5e8 = (string *)&mesh->faceVertexCounts;
    local_5f0 = (string *)&mesh->faceVertexIndices;
    local_5f8 = (string *)&mesh->cornerIndices;
    local_600 = (string *)&mesh->cornerSharpnesses;
    local_608 = (string *)&mesh->creaseIndices;
    local_610 = (string *)&mesh->creaseLengths;
    local_618 = (string *)&mesh->creaseSharpnesses;
    local_620 = (string *)&mesh->holeIndices;
    local_628 = (string *)&mesh->blendShapes;
    local_638 = &mesh->subsetFamilyTypeMap;
    local_630 = &(mesh->super_GPrim).props;
    local_658 = &mesh->faceVaryingLinearInterpolation;
    local_650 = &mesh->interpolateBoundary;
    local_648 = &mesh->subdivisionScheme;
    local_5e0 = &mesh->blendShapeTargets;
    local_6c8 = p_Var14;
    while( true ) {
      bVar3 = p_Var7 == p_Var14;
      if (bVar3) break;
      __lhs = p_Var7 + 1;
      bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"skel:skeleton");
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&ss_e,"skel:skeleton",(allocator *)&ret);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar6 == 0) {
          if (((ulong)p_Var7[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            if (*(uint *)&p_Var7[0x17]._M_left < 4) {
              args = &switchD_001c77ee::switchdataD_003123b0;
              switch(*(uint *)&p_Var7[0x17]._M_left) {
              default:
                nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                          (local_640,(Relationship *)&p_Var7[0x17]._M_left);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __lhs);
                goto LAB_001c780a;
              case 1:
                goto switchD_001c77ee_caseD_1;
              case 2:
                if ((long)p_Var7[0x1e]._M_left - (long)p_Var7[0x1e]._M_parent != 0xd0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar10 = ::std::operator<<(poVar10,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar10 = ::std::operator<<(poVar10,":");
                  poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                  poVar10 = ::std::operator<<(poVar10,"():");
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe65);
                  ::std::operator<<(poVar10," ");
                  pcVar12 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                  goto LAB_001c9b03;
                }
switchD_001c77ee_caseD_1:
                this_01 = local_640;
              }
              goto LAB_001c7de2;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe65);
            ::std::operator<<(poVar10," ");
            pcVar12 = "Internal error. Property `{}` is not a valid Relationship.";
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe65);
            ::std::operator<<(poVar10," ");
            pcVar12 = "Property `{}` must be a Relationship.";
          }
LAB_001c9b03:
          ::std::__cxx11::string::string((string *)&local_6e8,pcVar12,(allocator *)&local_678);
          in = &kSkelSkeleton;
LAB_001c9bbe:
          fmt::format<char_const*>((string *)&ret,(fmt *)&local_6e8,(string *)in,(char **)args);
          poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_001c9c58;
        }
      }
      else {
LAB_001c780a:
        bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"skel:blendShapeTargets");
        if (bVar4) {
          ::std::__cxx11::string::string((string *)&ss_e,"skel:blendShapeTargets",(allocator *)&ret)
          ;
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar6 != 0) goto LAB_001c9796;
          this_01 = local_5e0;
          if (((ulong)p_Var7[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe66);
            ::std::operator<<(poVar10," ");
            ::std::__cxx11::string::string
                      ((string *)&local_6e8,"`{}` must be a Relationship",(allocator *)&local_678);
            in = &kSkelBlendShapeTargets;
            goto LAB_001c9bbe;
          }
LAB_001c7de2:
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (this_01,(Relationship *)&p_Var7[0x17]._M_left);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
        }
        else {
          ::std::__cxx11::string::string(local_50,(string *)__lhs);
          this_00 = (GeomMesh *)(p_Var7 + 2);
          ::std::__cxx11::string::string((string *)&ss_e,"points",(allocator *)&local_6e8);
          args = (uint *)this_00;
          pPVar13 = (Property *)&ss_e;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                    (&ret,(_anonymous_namespace_ *)&table,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50,(string *)this_00,(Property *)&ss_e,local_5d0,target);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          iVar11 = 0;
          if ((ret._0_8_ & 0xfffffffd) == 0) {
            iVar11 = 3;
LAB_001c7a33:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (ret.code != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe67);
              ::std::operator<<(poVar10," ");
              ::std::__cxx11::string::string
                        ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                         (allocator *)&names);
              args = (uint *)&ret.err;
              fmt::format<char[7],std::__cxx11::string>
                        (&local_6e8,(fmt *)&local_678,(string *)"points",(char (*) [7])args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar13);
              poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_6e8,&local_678,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar11 = 1;
              goto LAB_001c7a33;
            }
          }
          ::std::__cxx11::string::_M_dispose();
          if (bVar4) {
            ::std::__cxx11::string::string(local_70,(string *)__lhs);
            ::std::__cxx11::string::string((string *)&ss_e,"normals",(allocator *)&local_6e8);
            args = (uint *)this_00;
            pPVar13 = (Property *)&ss_e;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                      (&ret,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(string *)this_00,(Property *)&ss_e,local_5d8,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        *)target);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar11 = 0;
            if ((ret._0_8_ & 0xfffffffd) == 0) {
              iVar11 = 3;
LAB_001c7bfc:
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if (ret.code != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe68);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                           (allocator *)&names);
                args = (uint *)&ret.err;
                fmt::format<char[8],std::__cxx11::string>
                          (&local_6e8,(fmt *)&local_678,(string *)"normals",(char (*) [8])args,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar13);
                poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_6e8,&local_678,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                iVar11 = 1;
                goto LAB_001c7bfc;
              }
            }
            ::std::__cxx11::string::_M_dispose();
            if (bVar4) {
              ::std::__cxx11::string::string(local_90,(string *)__lhs);
              ::std::__cxx11::string::string
                        ((string *)&ss_e,"faceVertexCounts",(allocator *)&local_6e8);
              args = (uint *)this_00;
              pPVar13 = (Property *)&ss_e;
              (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                        (&ret,(_anonymous_namespace_ *)&table,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90,(string *)this_00,(Property *)&ss_e,local_5e8,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                          *)target);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              iVar11 = 0;
              if ((ret._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_001c7dfe:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (ret.code != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar10 = ::std::operator<<(poVar10,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar10 = ::std::operator<<(poVar10,":");
                  poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                  poVar10 = ::std::operator<<(poVar10,"():");
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe6a);
                  ::std::operator<<(poVar10," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                             (allocator *)&names);
                  args = (uint *)&ret.err;
                  fmt::format<char[17],std::__cxx11::string>
                            (&local_6e8,(fmt *)&local_678,(string *)"faceVertexCounts",
                             (char (*) [17])args,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar13);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                  ::std::operator<<(poVar10,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_6e8,&local_678,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  iVar11 = 1;
                  goto LAB_001c7dfe;
                }
              }
              ::std::__cxx11::string::_M_dispose();
              if (bVar4) {
                ::std::__cxx11::string::string(local_b0,(string *)__lhs);
                ::std::__cxx11::string::string
                          ((string *)&ss_e,"faceVertexIndices",(allocator *)&local_6e8);
                args = (uint *)this_00;
                pPVar13 = (Property *)&ss_e;
                (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                          (&ret,(_anonymous_namespace_ *)&table,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_b0,(string *)this_00,(Property *)&ss_e,local_5f0,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                            *)target);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                iVar11 = 0;
                if ((ret._0_8_ & 0xfffffffd) == 0) {
                  iVar11 = 3;
LAB_001c7fc7:
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                  if (ret.code != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe6c);
                    ::std::operator<<(poVar10," ");
                    ::std::__cxx11::string::string
                              ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                               (allocator *)&names);
                    args = (uint *)&ret.err;
                    fmt::format<char[18],std::__cxx11::string>
                              (&local_6e8,(fmt *)&local_678,(string *)"faceVertexIndices",
                               (char (*) [18])args,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar13);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                    ::std::operator<<(poVar10,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_6e8,&local_678,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    iVar11 = 1;
                    goto LAB_001c7fc7;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (bVar4) {
                  ::std::__cxx11::string::string(local_d0,(string *)__lhs);
                  ::std::__cxx11::string::string
                            ((string *)&ss_e,"cornerIndices",(allocator *)&local_6e8);
                  args = (uint *)this_00;
                  pPVar13 = (Property *)&ss_e;
                  (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                            (&ret,(_anonymous_namespace_ *)&table,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d0,(string *)this_00,(Property *)&ss_e,local_5f8,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                              *)target);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  iVar11 = 0;
                  if ((ret._0_8_ & 0xfffffffd) == 0) {
                    iVar11 = 3;
LAB_001c8190:
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    if (ret.code != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe6f);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                                 (allocator *)&names);
                      args = (uint *)&ret.err;
                      fmt::format<char[14],std::__cxx11::string>
                                (&local_6e8,(fmt *)&local_678,(string *)"cornerIndices",
                                 (char (*) [14])args,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar13);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_6e8,&local_678,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)err);
                        ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      iVar11 = 1;
                      goto LAB_001c8190;
                    }
                  }
                  ::std::__cxx11::string::_M_dispose();
                  if (bVar4) {
                    ::std::__cxx11::string::string(local_f0,(string *)__lhs);
                    ::std::__cxx11::string::string
                              ((string *)&ss_e,"cornerSharpnesses",(allocator *)&local_6e8);
                    args = (uint *)this_00;
                    pPVar13 = (Property *)&ss_e;
                    (anonymous_namespace)::
                    ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                              (&ret,(_anonymous_namespace_ *)&table,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_f0,(string *)this_00,(Property *)&ss_e,local_600,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                                *)target);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    iVar11 = 0;
                    if ((ret._0_8_ & 0xfffffffd) == 0) {
                      iVar11 = 3;
LAB_001c8359:
                      bVar4 = false;
                    }
                    else {
                      bVar4 = true;
                      if (ret.code != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar10 = ::std::operator<<(poVar10,":");
                        poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                        poVar10 = ::std::operator<<(poVar10,"():");
                        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe71);
                        ::std::operator<<(poVar10," ");
                        ::std::__cxx11::string::string
                                  ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}",
                                   (allocator *)&names);
                        args = (uint *)&ret.err;
                        fmt::format<char[18],std::__cxx11::string>
                                  (&local_6e8,(fmt *)&local_678,(string *)"cornerSharpnesses",
                                   (char (*) [18])args,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar13);
                        poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                        ::std::operator<<(poVar10,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_6e8,&local_678,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)err);
                          ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        iVar11 = 1;
                        goto LAB_001c8359;
                      }
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (bVar4) {
                      ::std::__cxx11::string::string(local_110,(string *)__lhs);
                      ::std::__cxx11::string::string
                                ((string *)&ss_e,"creaseIndices",(allocator *)&local_6e8);
                      args = (uint *)this_00;
                      pPVar13 = (Property *)&ss_e;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                (&ret,(_anonymous_namespace_ *)&table,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_110,(string *)this_00,(Property *)&ss_e,local_608,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                  *)target);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      iVar11 = 0;
                      if ((ret._0_8_ & 0xfffffffd) == 0) {
                        iVar11 = 3;
LAB_001c8522:
                        bVar4 = false;
                      }
                      else {
                        bVar4 = true;
                        if (ret.code != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                          poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                          poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar10 = ::std::operator<<(poVar10,":");
                          poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                          poVar10 = ::std::operator<<(poVar10,"():");
                          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe73);
                          ::std::operator<<(poVar10," ");
                          ::std::__cxx11::string::string
                                    ((string *)&local_678,"Parsing attribute `{}` failed. Error: {}"
                                     ,(allocator *)&names);
                          args = (uint *)&ret.err;
                          fmt::format<char[14],std::__cxx11::string>
                                    (&local_6e8,(fmt *)&local_678,(string *)"creaseIndices",
                                     (char (*) [14])args,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar13);
                          poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                          ::std::operator<<(poVar10,"\n");
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          if (err != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_6e8,&local_678,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                          iVar11 = 1;
                          goto LAB_001c8522;
                        }
                      }
                      ::std::__cxx11::string::_M_dispose();
                      if (bVar4) {
                        ::std::__cxx11::string::string(local_130,(string *)__lhs);
                        ::std::__cxx11::string::string
                                  ((string *)&ss_e,"creaseLengths",(allocator *)&local_6e8);
                        args = (uint *)this_00;
                        pPVar13 = (Property *)&ss_e;
                        (anonymous_namespace)::
                        ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                  (&ret,(_anonymous_namespace_ *)&table,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_130,(string *)this_00,(Property *)&ss_e,local_610,
                                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                    *)target);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        iVar11 = 0;
                        if ((ret._0_8_ & 0xfffffffd) == 0) {
                          iVar11 = 3;
LAB_001c86eb:
                          bVar4 = false;
                        }
                        else {
                          bVar4 = true;
                          if (ret.code != Unmatched) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                            poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                            poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar10 = ::std::operator<<(poVar10,":");
                            poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                            poVar10 = ::std::operator<<(poVar10,"():");
                            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe75);
                            ::std::operator<<(poVar10," ");
                            ::std::__cxx11::string::string
                                      ((string *)&local_678,
                                       "Parsing attribute `{}` failed. Error: {}",
                                       (allocator *)&names);
                            args = (uint *)&ret.err;
                            fmt::format<char[14],std::__cxx11::string>
                                      (&local_6e8,(fmt *)&local_678,(string *)"creaseLengths",
                                       (char (*) [14])args,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar13);
                            poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                            ::std::operator<<(poVar10,"\n");
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            if (err != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_6e8,&local_678,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)err);
                              ::std::__cxx11::string::operator=((string *)err,(string *)&local_6e8);
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                            }
                            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                            iVar11 = 1;
                            goto LAB_001c86eb;
                          }
                        }
                        ::std::__cxx11::string::_M_dispose();
                        if (bVar4) {
                          ::std::__cxx11::string::string(local_150,(string *)__lhs);
                          ::std::__cxx11::string::string
                                    ((string *)&ss_e,"creaseSharpnesses",(allocator *)&local_6e8);
                          args = (uint *)this_00;
                          pPVar13 = (Property *)&ss_e;
                          (anonymous_namespace)::
                          ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                                    (&ret,(_anonymous_namespace_ *)&table,
                                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_150,(string *)this_00,(Property *)&ss_e,local_618,
                                     (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                                      *)target);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          iVar11 = 0;
                          if ((ret._0_8_ & 0xfffffffd) == 0) {
                            iVar11 = 3;
LAB_001c88b4:
                            bVar4 = false;
                          }
                          else {
                            bVar4 = true;
                            if (ret.code != Unmatched) {
                              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                              poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                              poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                              poVar10 = ::std::operator<<(poVar10,":");
                              poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                              poVar10 = ::std::operator<<(poVar10,"():");
                              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe77);
                              ::std::operator<<(poVar10," ");
                              ::std::__cxx11::string::string
                                        ((string *)&local_678,
                                         "Parsing attribute `{}` failed. Error: {}",
                                         (allocator *)&names);
                              args = (uint *)&ret.err;
                              fmt::format<char[18],std::__cxx11::string>
                                        (&local_6e8,(fmt *)&local_678,(string *)"creaseSharpnesses",
                                         (char (*) [18])args,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pPVar13);
                              poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                              ::std::operator<<(poVar10,"\n");
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              if (err != (string *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,&local_678,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                ::std::__cxx11::string::operator=
                                          ((string *)err,(string *)&local_6e8);
                                ::std::__cxx11::string::_M_dispose();
                                ::std::__cxx11::string::_M_dispose();
                              }
                              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                              iVar11 = 1;
                              goto LAB_001c88b4;
                            }
                          }
                          ::std::__cxx11::string::_M_dispose();
                          if (bVar4) {
                            ::std::__cxx11::string::string(local_170,(string *)__lhs);
                            ::std::__cxx11::string::string
                                      ((string *)&ss_e,"holeIndices",(allocator *)&local_6e8);
                            args = (uint *)this_00;
                            pPVar13 = (Property *)&ss_e;
                            (anonymous_namespace)::
                            ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                      (&ret,(_anonymous_namespace_ *)&table,
                                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_170,(string *)this_00,(Property *)&ss_e,local_620,
                                       (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                        *)target);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            iVar11 = 0;
                            if ((ret._0_8_ & 0xfffffffd) == 0) {
                              iVar11 = 3;
LAB_001c8a7d:
                              bVar4 = false;
                            }
                            else {
                              bVar4 = true;
                              if (ret.code != Unmatched) {
                                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e)
                                ;
                                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                                poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                poVar10 = ::std::operator<<(poVar10,":");
                                poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                poVar10 = ::std::operator<<(poVar10,"():");
                                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe79);
                                ::std::operator<<(poVar10," ");
                                ::std::__cxx11::string::string
                                          ((string *)&local_678,
                                           "Parsing attribute `{}` failed. Error: {}",
                                           (allocator *)&names);
                                args = (uint *)&ret.err;
                                fmt::format<char[12],std::__cxx11::string>
                                          (&local_6e8,(fmt *)&local_678,(string *)"holeIndices",
                                           (char (*) [12])args,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)pPVar13);
                                poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&local_6e8);
                                ::std::operator<<(poVar10,"\n");
                                ::std::__cxx11::string::_M_dispose();
                                ::std::__cxx11::string::_M_dispose();
                                if (err != (string *)0x0) {
                                  ::std::__cxx11::stringbuf::str();
                                  ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,&local_678,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                  ::std::__cxx11::string::operator=
                                            ((string *)err,(string *)&local_6e8);
                                  ::std::__cxx11::string::_M_dispose();
                                  ::std::__cxx11::string::_M_dispose();
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&ss_e);
                                iVar11 = 1;
                                goto LAB_001c8a7d;
                              }
                            }
                            ::std::__cxx11::string::_M_dispose();
                            if (bVar4) {
                              bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"subdivisionScheme");
                              if (bVar4) {
                                ::std::__cxx11::string::string
                                          ((string *)&ss_e,"subdivisionScheme",(allocator *)&ret);
                                sVar6 = ::std::
                                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::count(&table,(key_type *)&ss_e);
                                ::std::__cxx11::string::_M_dispose();
                                p_Var14 = local_6c8;
                                if (sVar6 == 0) {
                                  Property::value_type_name_abi_cxx11_
                                            ((string *)&ss_e,(Property *)this_00);
                                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_
                                            ();
                                  _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ss_e,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret);
                                  if ((_Var5) &&
                                     (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4),
                                     uVar1 < 2)) {
                                    ::std::__cxx11::string::_M_dispose();
                                    ::std::__cxx11::string::_M_dispose();
                                    if (uVar1 == 0) {
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)&ss_e);
                                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                      poVar10 = ::std::operator<<(poVar10,":");
                                      poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                      poVar10 = ::std::operator<<(poVar10,"():");
                                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe7c)
                                      ;
                                      ::std::operator<<(poVar10," ");
                                      poVar10 = ::std::operator<<((ostream *)&ss_e,
                                                                  "No value assigned to `");
                                      poVar10 = ::std::operator<<(poVar10,"subdivisionScheme");
                                      poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                                      ::std::operator<<(poVar10,"\n");
                                      if (warn != (string *)0x0) {
                                        ::std::__cxx11::stringbuf::str();
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)warn,(string *)&ret);
                                        ::std::__cxx11::string::_M_dispose();
                                        ::std::__cxx11::string::_M_dispose();
                                      }
                                      ::std::__cxx11::ostringstream::~ostringstream
                                                ((ostringstream *)&ss_e);
                                      AttrMetas::operator=
                                                (&local_648->_metas,(AttrMetas *)(p_Var7 + 7));
                                      pcVar12 = "subdivisionScheme";
LAB_001c901b:
                                      ::std::__cxx11::string::string
                                                ((string *)&ss_e,pcVar12,(allocator *)&ret);
                                      ::std::
                                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      ::_M_insert_unique<std::__cxx11::string>
                                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&table,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ss_e);
                                      ::std::__cxx11::string::_M_dispose();
                                      p_Var14 = local_6c8;
                                      goto LAB_001c9796;
                                    }
                                  }
                                  else {
                                    ::std::__cxx11::string::_M_dispose();
                                    ::std::__cxx11::string::_M_dispose();
                                  }
                                  ss_e = (ostringstream)0x0;
                                  uStack_447 = 0;
                                  sStack_444 = (storage_t<tinyusdz::Interpolation>)0x0;
                                  local_438[0] = ::std::
                                                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3618:35)>
                                                 ::_M_manager;
                                  ::std::__cxx11::string::string
                                            ((string *)&ret,"subdivisionScheme",
                                             (allocator *)&local_6e8);
                                  bVar4 = options->strict_allowedToken_check;
                                  ::std::
                                  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                              *)&local_1b0,
                                             (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                              *)&ss_e);
                                  target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                            *)err;
                                  bVar4 = ParseUniformEnumProperty<tinyusdz::GeomMesh::SubdivisionScheme,tinyusdz::GeomMesh::SubdivisionScheme>
                                                    ((string *)&ret,bVar4,
                                                     (
                                                  EnumHandlerFun<tinyusdz::GeomMesh::SubdivisionScheme>
                                                  *)&local_1b0,(Attribute *)this_00,local_648,warn,
                                                  err);
                                  args = (uint *)this_00;
                                  if (local_1a0 != (code *)0x0) {
                                    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
                                    args = (uint *)this_00;
                                  }
                                  ::std::__cxx11::string::_M_dispose();
                                  iVar11 = 1;
                                  if (bVar4) {
                                    AttrMetas::operator=
                                              (&local_648->_metas,(AttrMetas *)(p_Var7 + 7));
                                    pcVar12 = "subdivisionScheme";
LAB_001c974a:
                                    ::std::__cxx11::string::string
                                              ((string *)&ret,pcVar12,(allocator *)&local_6e8);
                                    ::std::
                                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    ::_M_insert_unique<std::__cxx11::string>
                                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                *)&table,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&ret);
                                    ::std::__cxx11::string::_M_dispose();
                                    iVar11 = 3;
                                  }
LAB_001c976c:
                                  if (local_438[0] != (code *)0x0) {
                                    (*local_438[0])((Property *)&ss_e,(Property *)&ss_e,3);
                                  }
                                  goto LAB_001c9784;
                                }
                              }
                              else {
                                bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"interpolateBoundary");
                                p_Var14 = local_6c8;
                                if (bVar4) {
                                  ::std::__cxx11::string::string
                                            ((string *)&ss_e,"interpolateBoundary",(allocator *)&ret
                                            );
                                  sVar6 = ::std::
                                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::count(&table,(key_type *)&ss_e);
                                  ::std::__cxx11::string::_M_dispose();
                                  if (sVar6 == 0) {
                                    Property::value_type_name_abi_cxx11_
                                              ((string *)&ss_e,(Property *)this_00);
                                    tinyusdz::value::TypeTraits<tinyusdz::Token>::
                                    type_name_abi_cxx11_();
                                    _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ss_e,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret);
                                    if ((_Var5) &&
                                       (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4),
                                       uVar1 < 2)) {
                                      ::std::__cxx11::string::_M_dispose();
                                      ::std::__cxx11::string::_M_dispose();
                                      if (uVar1 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)&ss_e);
                                        poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                                        poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                        poVar10 = ::std::operator<<(poVar10,":");
                                        poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                        poVar10 = ::std::operator<<(poVar10,"():");
                                        poVar10 = (ostream *)
                                                  ::std::ostream::operator<<(poVar10,0xe7f);
                                        ::std::operator<<(poVar10," ");
                                        poVar10 = ::std::operator<<((ostream *)&ss_e,
                                                                    "No value assigned to `");
                                        poVar10 = ::std::operator<<(poVar10,"interpolateBoundary");
                                        poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                                        ::std::operator<<(poVar10,"\n");
                                        if (warn != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)warn,(string *)&ret);
                                          ::std::__cxx11::string::_M_dispose();
                                          ::std::__cxx11::string::_M_dispose();
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)&ss_e);
                                        AttrMetas::operator=
                                                  (&local_650->_metas,(AttrMetas *)(p_Var7 + 7));
                                        pcVar12 = "interpolateBoundary";
                                        goto LAB_001c901b;
                                      }
                                    }
                                    else {
                                      ::std::__cxx11::string::_M_dispose();
                                      ::std::__cxx11::string::_M_dispose();
                                    }
                                    ss_e = (ostringstream)0x0;
                                    uStack_447 = 0;
                                    sStack_444 = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_438[0] = ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3632:37)>
                                                  ::_M_manager;
                                    ::std::__cxx11::string::string
                                              ((string *)&ret,"interpolateBoundary",
                                               (allocator *)&local_6e8);
                                    bVar4 = options->strict_allowedToken_check;
                                    ::std::
                                    function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                *)&local_1d0,
                                               (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                *)&ss_e);
                                    target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                              *)err;
                                    bVar4 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::InterpolateBoundary,tinyusdz::GeomMesh::InterpolateBoundary>
                                                      ((string *)&ret,bVar4,
                                                       (
                                                  EnumHandlerFun<tinyusdz::GeomMesh::InterpolateBoundary>
                                                  *)&local_1d0,(Attribute *)this_00,local_650,warn,
                                                  err);
                                    args = (uint *)this_00;
                                    if (local_1c0 != (code *)0x0) {
                                      (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
                                      args = (uint *)this_00;
                                    }
                                    ::std::__cxx11::string::_M_dispose();
                                    iVar11 = 1;
                                    if (bVar4) {
                                      AttrMetas::operator=
                                                (&local_650->_metas,(AttrMetas *)(p_Var7 + 7));
                                      pcVar12 = "interpolateBoundary";
                                      goto LAB_001c974a;
                                    }
                                    goto LAB_001c976c;
                                  }
                                }
                                else {
                                  bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"facevaryingLinearInterpolation");
                                  if (bVar4) {
                                    ::std::__cxx11::string::string
                                              ((string *)&ss_e,"facevaryingLinearInterpolation",
                                               (allocator *)&ret);
                                    sVar6 = ::std::
                                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::count(&table,(key_type *)&ss_e);
                                    ::std::__cxx11::string::_M_dispose();
                                    if (sVar6 == 0) {
                                      Property::value_type_name_abi_cxx11_
                                                ((string *)&ss_e,(Property *)this_00);
                                      tinyusdz::value::TypeTraits<tinyusdz::Token>::
                                      type_name_abi_cxx11_();
                                      _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ss_e,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret);
                                      if ((_Var5) &&
                                         (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4),
                                         uVar1 < 2)) {
                                        ::std::__cxx11::string::_M_dispose();
                                        ::std::__cxx11::string::_M_dispose();
                                        if (uVar1 == 0) {
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)&ss_e);
                                          poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                                          poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                          poVar10 = ::std::operator<<(poVar10,":");
                                          poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                          poVar10 = ::std::operator<<(poVar10,"():");
                                          poVar10 = (ostream *)
                                                    ::std::ostream::operator<<(poVar10,0xe82);
                                          ::std::operator<<(poVar10," ");
                                          poVar10 = ::std::operator<<((ostream *)&ss_e,
                                                                      "No value assigned to `");
                                          poVar10 = ::std::operator<<(poVar10,
                                                  "facevaryingLinearInterpolation");
                                          poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                                          ::std::operator<<(poVar10,"\n");
                                          if (warn != (string *)0x0) {
                                            ::std::__cxx11::stringbuf::str();
                                            ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                            ::std::__cxx11::string::operator=
                                                      ((string *)warn,(string *)&ret);
                                            ::std::__cxx11::string::_M_dispose();
                                            ::std::__cxx11::string::_M_dispose();
                                          }
                                          ::std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)&ss_e);
                                          AttrMetas::operator=
                                                    (&local_658->_metas,(AttrMetas *)(p_Var7 + 7));
                                          pcVar12 = "facevaryingLinearInterpolation";
                                          goto LAB_001c901b;
                                        }
                                      }
                                      else {
                                        ::std::__cxx11::string::_M_dispose();
                                        ::std::__cxx11::string::_M_dispose();
                                      }
                                      ss_e = (ostringstream)0x0;
                                      uStack_447 = 0;
                                      sStack_444 = (storage_t<tinyusdz::Interpolation>)0x0;
                                      local_438[0] = ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3645:48)>
                                                  ::_M_manager;
                                      ::std::__cxx11::string::string
                                                ((string *)&ret,"facevaryingLinearInterpolation",
                                                 (allocator *)&local_6e8);
                                      bVar4 = options->strict_allowedToken_check;
                                      ::std::
                                      function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                  *)&local_1f0,
                                                 (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                  *)&ss_e);
                                      target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                                *)err;
                                      bVar4 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                                        ((string *)&ret,bVar4,
                                                         (
                                                  EnumHandlerFun<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                                  *)&local_1f0,(Attribute *)this_00,local_658,warn,
                                                  err);
                                      args = (uint *)this_00;
                                      if (local_1e0 != (code *)0x0) {
                                        (*local_1e0)(&local_1f0,&local_1f0,__destroy_functor);
                                        args = (uint *)this_00;
                                      }
                                      ::std::__cxx11::string::_M_dispose();
                                      iVar11 = 1;
                                      if (bVar4) {
                                        AttrMetas::operator=
                                                  (&local_658->_metas,(AttrMetas *)(p_Var7 + 7));
                                        pcVar12 = "facevaryingLinearInterpolation";
                                        goto LAB_001c974a;
                                      }
                                      goto LAB_001c976c;
                                    }
                                  }
                                  else {
                                    ::std::__cxx11::string::string(local_190,(string *)__lhs);
                                    ::std::__cxx11::string::string
                                              ((string *)&ss_e,"skel:blendShapes",
                                               (allocator *)&local_6e8);
                                    args = (uint *)this_00;
                                    pPVar13 = (Property *)&ss_e;
                                    (anonymous_namespace)::
                                    ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                              (&ret,(_anonymous_namespace_ *)&table,
                                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_190,(string *)this_00,(Property *)&ss_e,
                                               local_628,
                                               (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                *)target);
                                    ::std::__cxx11::string::_M_dispose();
                                    ::std::__cxx11::string::_M_dispose();
                                    iVar11 = 0;
                                    if ((ret._0_8_ & 0xfffffffd) == 0) {
                                      iVar11 = 3;
LAB_001c93bf:
                                      bVar4 = false;
                                    }
                                    else {
                                      bVar4 = true;
                                      if (ret.code != Unmatched) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)&ss_e);
                                        poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                                        poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                        poVar10 = ::std::operator<<(poVar10,":");
                                        poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                        poVar10 = ::std::operator<<(poVar10,"():");
                                        poVar10 = (ostream *)
                                                  ::std::ostream::operator<<(poVar10,0xe84);
                                        ::std::operator<<(poVar10," ");
                                        ::std::__cxx11::string::string
                                                  ((string *)&local_678,
                                                   "Parsing attribute `{}` failed. Error: {}",
                                                   (allocator *)&names);
                                        args = (uint *)&ret.err;
                                        fmt::format<char_const*,std::__cxx11::string>
                                                  (&local_6e8,(fmt *)&local_678,
                                                   (string *)&kSkelBlendShapes,(char **)args,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pPVar13);
                                        poVar10 = ::std::operator<<((ostream *)&ss_e,
                                                                    (string *)&local_6e8);
                                        ::std::operator<<(poVar10,"\n");
                                        ::std::__cxx11::string::_M_dispose();
                                        ::std::__cxx11::string::_M_dispose();
                                        if (err != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,&local_678,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)err,(string *)&local_6e8);
                                          ::std::__cxx11::string::_M_dispose();
                                          ::std::__cxx11::string::_M_dispose();
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)&ss_e);
                                        iVar11 = 1;
                                        goto LAB_001c93bf;
                                      }
                                    }
                                    ::std::__cxx11::string::_M_dispose();
                                    if (!bVar4) goto LAB_001c9784;
                                    ::std::__cxx11::string::string
                                              ((string *)&ss_e,"subsetFamily",(allocator *)&ret);
                                    bVar4 = startsWith((string *)__lhs,(string *)&ss_e);
                                    ::std::__cxx11::string::_M_dispose();
                                    if (bVar4) {
                                      ::std::__cxx11::string::string
                                                ((string *)&ss_e,":",(allocator *)&ret);
                                      args = (uint *)0x147ae14;
                                      split(&names,(string *)__lhs,(string *)&ss_e,0x147ae14);
                                      ::std::__cxx11::string::_M_dispose();
                                      if ((((long)names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x60)
                                          && (bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "subsetFamily"), bVar4)) &&
                                         (bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2),
                                                  "familyType"), bVar4)) {
                                        ret.code = AlreadyProcessed;
                                        TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                        ::TypedAttributeWithFallback
                                                  ((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)&ss_e,&ret.code);
                                        _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs);
                                        if (_Var5) {
                                          sVar6 = ::std::
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&table,(key_type *)__lhs);
                                          iVar11 = 3;
                                          if (sVar6 == 0) {
                                            Property::value_type_name_abi_cxx11_
                                                      ((string *)&ret,(Property *)this_00);
                                            tinyusdz::value::TypeTraits<tinyusdz::Token>::
                                            type_name_abi_cxx11_();
                                            _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,&local_6e8);
                                            if ((_Var5) &&
                                               (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4)
                                               , uVar1 < 2)) {
                                              ::std::__cxx11::string::_M_dispose();
                                              ::std::__cxx11::string::_M_dispose();
                                              if (uVar1 == 0) {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          ((ostringstream *)&ret);
                                                poVar10 = ::std::operator<<((ostream *)&ret,"[warn]"
                                                                           );
                                                poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                                poVar10 = ::std::operator<<(poVar10,":");
                                                poVar10 = ::std::operator<<(poVar10,
                                                  "ReconstructPrim");
                                                poVar10 = ::std::operator<<(poVar10,"():");
                                                poVar10 = (ostream *)
                                                          ::std::ostream::operator<<(poVar10,0xe94);
                                                ::std::operator<<(poVar10," ");
                                                poVar10 = ::std::operator<<((ostream *)&ret,
                                                                            "No value assigned to `"
                                                                           );
                                                poVar10 = ::std::operator<<(poVar10,(string *)__lhs)
                                                ;
                                                poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                                                ::std::operator<<(poVar10,"\n");
                                                if (warn != (string *)0x0) {
                                                  ::std::__cxx11::stringbuf::str();
                                                  ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,&local_678,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                                  ::std::__cxx11::string::operator=
                                                            ((string *)warn,(string *)&local_6e8);
                                                  ::std::__cxx11::string::_M_dispose();
                                                  ::std::__cxx11::string::_M_dispose();
                                                }
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          ((ostringstream *)&ret);
                                                AttrMetas::operator=
                                                          ((AttrMetas *)&ss_e,
                                                           (AttrMetas *)(p_Var7 + 7));
                                                ::std::
                                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                ::_M_insert_unique<std::__cxx11::string_const&>
                                                          ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&table,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs);
                                                iVar11 = 3;
                                                goto LAB_001c97f1;
                                              }
                                            }
                                            else {
                                              ::std::__cxx11::string::_M_dispose();
                                              ::std::__cxx11::string::_M_dispose();
                                            }
                                            ret.code = Success;
                                            ret._4_4_ = 0;
                                            ret.err._M_dataplus._M_p = (pointer)0x0;
                                            ret.err.field_2._M_allocated_capacity =
                                                 (size_type)
                                                 ::std::
                                                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                 ::_M_invoke;
                                            ret.err._M_string_length =
                                                 (size_type)
                                                 ::std::
                                                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                 ::_M_manager;
                                            bVar4 = options->strict_allowedToken_check;
                                            ::std::
                                            function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                            ::function(&local_210,
                                                       (
                                                  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                  *)&ret);
                                            args = (uint *)this_00;
                                            target = (
                                                  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                                  *)err;
                                            bVar4 = 
                                                  ParseUniformEnumProperty<tinyusdz::GeomSubset::FamilyType,tinyusdz::GeomSubset::FamilyType>
                                                            ((string *)__lhs,bVar4,&local_210,
                                                             (Attribute *)this_00,
                                                             (
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)&ss_e,warn,err);
                                            if (local_210.super__Function_base._M_manager !=
                                                (code *)0x0) {
                                              (*local_210.super__Function_base._M_manager)
                                                        (&local_210,&local_210,3);
                                            }
                                            iVar11 = 1;
                                            if (bVar4) {
                                              AttrMetas::operator=
                                                        ((AttrMetas *)&ss_e,
                                                         (AttrMetas *)(p_Var7 + 7));
                                              ::std::
                                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                              ::_M_insert_unique<std::__cxx11::string_const&>
                                                        ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&table,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs);
                                              iVar11 = 3;
                                            }
                                            if (ret.err._M_string_length != 0) {
                                              (*(code *)ret.err._M_string_length)(&ret,&ret,3);
                                            }
                                          }
                                        }
                                        else {
                                          pFVar8 = 
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  ::get_value((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)&ss_e);
                                          FVar2 = *pFVar8;
                                          Token::Token((Token *)&ret,
                                                       names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                          pmVar9 = ::std::
                                                  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                                                  ::operator[](local_638,(key_type *)&ret);
                                          *pmVar9 = FVar2;
                                          ::std::__cxx11::string::_M_dispose();
                                          iVar11 = 0;
                                        }
LAB_001c97f1:
                                        TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                        ::~TypedAttributeWithFallback
                                                  ((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)&ss_e);
                                        if (iVar11 == 0) goto LAB_001c9805;
                                      }
                                      else {
LAB_001c9805:
                                        iVar11 = 0;
                                      }
                                      ::std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~vector(&names);
                                      if (iVar11 != 0) goto LAB_001c9784;
                                    }
                                    sVar6 = ::std::
                                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::count(&table,(key_type *)__lhs);
                                    if (sVar6 == 0) {
                                      this = ::std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                             ::operator[](local_630,(key_type *)__lhs);
                                      Property::operator=(this,(Property *)this_00);
                                      ::std::
                                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      ::_M_insert_unique<std::__cxx11::string_const&>
                                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&table,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs);
                                    }
                                    sVar6 = ::std::
                                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::count(&table,(key_type *)__lhs);
                                    p_Var14 = local_6c8;
                                    if (sVar6 == 0) {
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)&ss_e);
                                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                      poVar10 = ::std::operator<<(poVar10,":");
                                      poVar10 = ::std::operator<<(poVar10,"ReconstructPrim");
                                      poVar10 = ::std::operator<<(poVar10,"():");
                                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xea0)
                                      ;
                                      ::std::operator<<(poVar10," ");
                                      ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,"Unsupported/unimplemented property: ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs);
                                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
                                      ::std::operator<<(poVar10,"\n");
                                      ::std::__cxx11::string::_M_dispose();
                                      if (warn != (string *)0x0) {
                                        ::std::__cxx11::stringbuf::str();
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_6e8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)err);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)warn,(string *)&ret);
                                        ::std::__cxx11::string::_M_dispose();
                                        ::std::__cxx11::string::_M_dispose();
                                      }
                                      ::std::__cxx11::ostringstream::~ostringstream
                                                ((ostringstream *)&ss_e);
                                      p_Var14 = local_6c8;
                                    }
                                  }
                                }
                              }
                              goto LAB_001c9796;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_001c9784:
          p_Var14 = local_6c8;
          if ((iVar11 != 3) && (iVar11 != 0)) break;
        }
      }
LAB_001c9796:
      p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7);
    }
  }
  else {
LAB_001c9c58:
    bVar3 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar3;
}

Assistant:

bool ReconstructPrim<GeomMesh>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomMesh *mesh,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  DCOUT("GeomMesh");

  auto SubdivisionSchemeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::SubdivisionScheme, std::string> {
    using EnumTy = std::pair<GeomMesh::SubdivisionScheme, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::SubdivisionScheme::SubdivisionSchemeNone, "none"),
        std::make_pair(GeomMesh::SubdivisionScheme::CatmullClark,
                       "catmullClark"),
        std::make_pair(GeomMesh::SubdivisionScheme::Loop, "loop"),
        std::make_pair(GeomMesh::SubdivisionScheme::Bilinear, "bilinear"),
    };
    return EnumHandler<GeomMesh::SubdivisionScheme>("subdivisionScheme", tok,
                                                    enums);
  };

  auto InterpolateBoundaryHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::InterpolateBoundary, std::string> {
    using EnumTy = std::pair<GeomMesh::InterpolateBoundary, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::InterpolateBoundary::InterpolateBoundaryNone, "none"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeAndCorner,
                       "edgeAndCorner"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeOnly, "edgeOnly"),
    };
    return EnumHandler<GeomMesh::InterpolateBoundary>("interpolateBoundary",
                                                      tok, enums);
  };

  auto FaceVaryingLinearInterpolationHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::FaceVaryingLinearInterpolation,
                          std::string> {
    using EnumTy =
        std::pair<GeomMesh::FaceVaryingLinearInterpolation, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus1,
                       "cornersPlus1"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus2,
                       "cornersPlus2"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersOnly,
                       "cornersOnly"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::Boundaries,
                       "boundaries"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::FaceVaryingLinearInterpolationNone, "none"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::All, "all"),
    };
    return EnumHandler<GeomMesh::FaceVaryingLinearInterpolation>(
        "facevaryingLinearInterpolation", tok, enums);
  };

  auto FamilyTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::FamilyType, std::string> {
    using EnumTy = std::pair<GeomSubset::FamilyType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::FamilyType::Partition, "partition"),
        std::make_pair(GeomSubset::FamilyType::NonOverlapping, "nonOverlapping"),
        std::make_pair(GeomSubset::FamilyType::Unrestricted, "unrestricted"),
    };
    return EnumHandler<GeomSubset::FamilyType>("familyType", tok,
                                                    enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, mesh, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("GeomMesh prop: " << prop.first);
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kSkelSkeleton, mesh->skeleton)
    PARSE_TARGET_PATHS_RELATION(table, prop, kSkelBlendShapeTargets, mesh->blendShapeTargets)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomMesh, mesh->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomMesh, mesh->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexCounts", GeomMesh,
                         mesh->faceVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexIndices", GeomMesh,
                         mesh->faceVertexIndices)
    // Subd
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerIndices", GeomMesh,
                         mesh->cornerIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerSharpnesses", GeomMesh,
                         mesh->cornerSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseIndices", GeomMesh,
                         mesh->creaseIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseLengths", GeomMesh,
                         mesh->creaseLengths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseSharpnesses", GeomMesh,
                         mesh->creaseSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "holeIndices", GeomMesh,
                         mesh->holeIndices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "subdivisionScheme", GeomMesh::SubdivisionScheme,
                       SubdivisionSchemeHandler, GeomMesh,
                       mesh->subdivisionScheme, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "interpolateBoundary",
                       GeomMesh::InterpolateBoundary, InterpolateBoundaryHandler, GeomMesh,
                       mesh->interpolateBoundary, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "facevaryingLinearInterpolation",
                       GeomMesh::FaceVaryingLinearInterpolation, FaceVaryingLinearInterpolationHandler, GeomMesh,
                       mesh->faceVaryingLinearInterpolation, options.strict_allowedToken_check)
    // blendShape names
    PARSE_TYPED_ATTRIBUTE(table, prop, kSkelBlendShapes, GeomMesh, mesh->blendShapes)

    // subsetFamily for GeomSubset
    if (startsWith(prop.first, "subsetFamily")) {
      // uniform subsetFamily::<FAMILYNAME>:familyType = ...
      std::vector<std::string> names = split(prop.first, ":");

      if ((names.size() == 3) &&
          (names[0] == "subsetFamily") &&
          (names[2] == "familyType")) {

        DCOUT("subsetFamily" << prop.first);
        TypedAttributeWithFallback<GeomSubset::FamilyType> familyType{GeomSubset::FamilyType::Unrestricted};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first,
                           GeomSubset::FamilyType, FamilyTypeHandler, GeomMesh,
                           familyType, options.strict_allowedToken_check)

        // NOTE: Ignore metadataum of familyType.
        
        // TODO: Validate familyName
        mesh->subsetFamilyTypeMap[value::token(names[1])] = familyType.get_value();

      }
    }

    // generic
    ADD_PROPERTY(table, prop, GeomMesh, mesh->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }


  return true;
}